

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

char * __thiscall CVmObject::get_image_file_version(CVmObject *this)

{
  CVmMetaclass *this_00;
  vm_meta_entry_t *pvVar1;
  undefined8 *in_RDI;
  char *n;
  vm_meta_entry_t *entry;
  undefined8 in_stack_ffffffffffffffe0;
  CVmMetaTable *in_stack_ffffffffffffffe8;
  char *local_8;
  
  this_00 = (CVmMetaclass *)(**(code **)*in_RDI)();
  CVmMetaclass::get_reg_idx(this_00);
  pvVar1 = CVmMetaTable::get_entry_from_reg
                     (in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if ((pvVar1 == (vm_meta_entry_t *)0x0) ||
     (local_8 = strchr(pvVar1->image_meta_name_,0x2f), local_8 == (char *)0x0)) {
    local_8 = "\t";
  }
  local_8 = local_8 + 1;
  return local_8;
}

Assistant:

const char *CVmObject::get_image_file_version(VMG0_) const
{
    /* get the metaclass table entry */
    vm_meta_entry_t *entry = G_meta_table->get_entry_from_reg(
        get_metaclass_reg()->get_reg_idx());

    /* if we found it, get the image metaclass string from the entry */
    if (entry != 0)
    {
        /* get the image metaclass name - "name/version" */
        const char *n = entry->image_meta_name_;

        /* scan for the version slash */
        n = strchr(n, '/');

        /* if we found it, the version follows the slash */
        if (n != 0)
            return n + 1;
    }

    /* we couldn't find the version data, so return an empty string */
    return "";
}